

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_gcnew(runtime_type *this,var *b)

{
  bool bVar1;
  runtime_error *this_00;
  proxy *in_RDI;
  any *unaff_retaddr;
  string *in_stack_ffffffffffffff78;
  any *in_stack_ffffffffffffff80;
  function<cs_impl::any_()> *in_stack_ffffffffffffff88;
  allocator *paVar2;
  type_info *in_stack_ffffffffffffff90;
  proxy *args;
  allocator local_51;
  string local_50 [80];
  
  args = in_RDI;
  cs_impl::any::type(in_stack_ffffffffffffff80);
  bVar1 = std::type_info::operator==
                    (in_stack_ffffffffffffff90,(type_info *)in_stack_ffffffffffffff88);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    paVar2 = &local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"Unsupported operator operations(GcNew).",paVar2);
    runtime_error::runtime_error(this_00,in_stack_ffffffffffffff78);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  cs_impl::any::const_val<cs::type_t>(unaff_retaddr);
  std::function<cs_impl::any_()>::operator()(in_stack_ffffffffffffff88);
  cs_impl::any::make<cs::pointer,cs_impl::any>((any *)args);
  cs_impl::any::~any((any *)0x1c81dc);
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_gcnew(const var &b)
	{
		if (b.type() == typeid(type_t))
			return var::make<pointer>(b.const_val<type_t>().constructor());
		else
			throw runtime_error("Unsupported operator operations(GcNew).");
	}